

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_generated.h
# Opt level: O2

TypeTable * MyGame::Example::LongEnumTypeTable(void)

{
  return &LongEnumTypeTable::tt;
}

Assistant:

inline const ::flatbuffers::TypeTable *LongEnumTypeTable() {
  static const ::flatbuffers::TypeCode type_codes[] = {
    { ::flatbuffers::ET_ULONG, 0, 0 },
    { ::flatbuffers::ET_ULONG, 0, 0 },
    { ::flatbuffers::ET_ULONG, 0, 0 }
  };
  static const ::flatbuffers::TypeFunction type_refs[] = {
    MyGame::Example::LongEnumTypeTable
  };
  static const int64_t values[] = { 2ULL, 4ULL, 1099511627776ULL };
  static const char * const names[] = {
    "LongOne",
    "LongTwo",
    "LongBig"
  };
  static const ::flatbuffers::TypeTable tt = {
    ::flatbuffers::ST_ENUM, 3, type_codes, type_refs, nullptr, values, names
  };
  return &tt;
}